

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  size_type sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  bitwidth_t bVar5;
  undefined4 uVar6;
  pointer pNVar7;
  pointer pNVar8;
  pointer pNVar9;
  pointer pNVar10;
  EVP_PKEY_CTX *pEVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  pointer pNVar13;
  
  pNVar13 = this->data_ + this->len;
  if (this->len != this->cap) {
    bVar5 = args->width;
    uVar6 = *(undefined4 *)&args->field_0xc;
    pNVar13->netType = args->netType;
    pNVar13->width = bVar5;
    *(undefined4 *)&pNVar13->field_0xc = uVar6;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar11 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar11 < ctx) {
    pEVar11 = ctx;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    pEVar11 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar12 = (long)pNVar13 - (long)this->data_;
  pNVar7 = (pointer)operator_new((long)pEVar11 << 4);
  uVar4 = *(undefined8 *)&args->width;
  *(undefined8 *)((long)pNVar7 + lVar12) = args->netType;
  ((undefined8 *)((long)pNVar7 + lVar12))[1] = uVar4;
  pNVar10 = this->data_;
  pNVar8 = pNVar10 + this->len;
  pNVar9 = pNVar7;
  if (pNVar8 == pNVar13) {
    for (; pNVar10 != pNVar13; pNVar10 = pNVar10 + 1) {
      bVar5 = pNVar10->width;
      uVar6 = *(undefined4 *)&pNVar10->field_0xc;
      pNVar9->netType = pNVar10->netType;
      pNVar9->width = bVar5;
      *(undefined4 *)&pNVar9->field_0xc = uVar6;
      pNVar9 = pNVar9 + 1;
    }
  }
  else {
    for (; pNVar10 != pNVar13; pNVar10 = pNVar10 + 1) {
      bVar5 = pNVar10->width;
      uVar6 = *(undefined4 *)&pNVar10->field_0xc;
      pNVar9->netType = pNVar10->netType;
      pNVar9->width = bVar5;
      *(undefined4 *)&pNVar9->field_0xc = uVar6;
      pNVar9 = pNVar9 + 1;
    }
    puVar3 = (undefined8 *)(lVar12 + (long)pNVar7);
    for (; pNVar13 != pNVar8; pNVar13 = pNVar13 + 1) {
      uVar4 = *(undefined8 *)&pNVar13->width;
      puVar3[2] = pNVar13->netType;
      puVar3[3] = uVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar11;
  this->data_ = pNVar7;
  return (reference)((long)pNVar7 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }